

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner_test.cc
# Opt level: O2

void __thiscall AwsCommandRunner_CopyFile_Test::TestBody(AwsCommandRunner_CopyFile_Test *this)

{
  bool bVar1;
  MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *pMVar2;
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *pTVar3;
  MockSpec<bool_()> *pMVar4;
  TypedExpectation<bool_()> *pTVar5;
  long lVar6;
  char *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  AssertHelper AStack_2b8;
  allocator local_2ac;
  allocator_type local_2ab;
  allocator local_2aa;
  allocator local_2a9;
  undefined1 local_2a8 [8];
  linked_ptr_internal lStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Base_ptr local_288;
  size_t local_280;
  string local_278;
  AssertionResult gtest_ar_;
  AwsCommandRunner aws_command_runner;
  string local_1b8 [32];
  MultipleCommandRunner multiple_command_runner;
  MockCommandRunner command_runner;
  
  anon_unknown.dwarf_103e0::MockCommandRunner::MockCommandRunner(&command_runner);
  MultipleCommandRunner::MultipleCommandRunner
            (&multiple_command_runner,&command_runner.super_CommandRunner);
  std::__cxx11::string::string((string *)&aws_command_runner,"aws",(allocator *)&local_278);
  std::__cxx11::string::string
            ((string *)(aws_command_runner.local_path_.field_2._M_local_buf + 8),"s3",
             (allocator *)&AStack_2b8);
  std::__cxx11::string::string
            ((string *)(aws_command_runner.s3_bucket_.field_2._M_local_buf + 8),"rm",&local_2ac);
  std::__cxx11::string::string
            ((string *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             ,"--recursive",&local_2a9);
  std::__cxx11::string::string(local_1b8,"s3://bucket/foo",&local_2aa);
  __l._M_len = 5;
  __l._M_array = (iterator)&aws_command_runner;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar_,__l,&local_2ab);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::Matcher((Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
             *)local_2a8,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  pMVar2 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_RunCommand
                     (&command_runner,
                      (Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                       *)local_2a8);
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x3c,"command_runner",
                      "RunCommand(std::vector<std::string>({ \"aws\", \"s3\", \"rm\", \"--recursive\", \"s3://bucket/foo\", }))"
                     );
  testing::internal::
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::Times(pTVar3,1);
  testing::internal::
  MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~MatcherBase((MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                  *)local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  lVar6 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&aws_command_runner.command_runner_ + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string((string *)&aws_command_runner,"aws",(allocator *)&local_278);
  std::__cxx11::string::string
            ((string *)(aws_command_runner.local_path_.field_2._M_local_buf + 8),"s3",
             (allocator *)&AStack_2b8);
  std::__cxx11::string::string
            ((string *)(aws_command_runner.s3_bucket_.field_2._M_local_buf + 8),"cp",&local_2ac);
  std::__cxx11::string::string
            ((string *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             ,"/tmp/foo",&local_2a9);
  std::__cxx11::string::string(local_1b8,"s3://bucket/foo",&local_2aa);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&aws_command_runner;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar_,__l_00,&local_2ab);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::Matcher((Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
             *)local_2a8,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  pMVar2 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_RunCommand
                     (&command_runner,
                      (Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                       *)local_2a8);
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x41,"command_runner",
                      "RunCommand(std::vector<std::string>({ \"aws\", \"s3\", \"cp\", \"/tmp/foo\", \"s3://bucket/foo\", }))"
                     );
  testing::internal::
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::Times(pTVar3,1);
  testing::internal::
  MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~MatcherBase((MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                  *)local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  lVar6 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&aws_command_runner.command_runner_ + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  pMVar4 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_Finished(&command_runner);
  pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x43,"command_runner","Finished()");
  local_2a8 = (undefined1  [8])operator_new(1);
  *(undefined1 *)local_2a8 = 1;
  lStack_2a0.next_ = &lStack_2a0;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&aws_command_runner);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly
            (pTVar5,(Action<bool_()> *)&aws_command_runner);
  testing::internal::linked_ptr<testing::ActionInterface<bool_()>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_()>_> *)&aws_command_runner);
  testing::internal::linked_ptr<bool>::~linked_ptr((linked_ptr<bool> *)local_2a8);
  pMVar4 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_PreviousCommandFailed(&command_runner)
  ;
  pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x44,"command_runner","PreviousCommandFailed()");
  local_2a8 = (undefined1  [8])operator_new(1);
  *(undefined1 *)local_2a8 = 0;
  lStack_2a0.next_ = &lStack_2a0;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&aws_command_runner);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly
            (pTVar5,(Action<bool_()> *)&aws_command_runner);
  testing::internal::linked_ptr<testing::ActionInterface<bool_()>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_()>_> *)&aws_command_runner);
  testing::internal::linked_ptr<bool>::~linked_ptr((linked_ptr<bool> *)local_2a8);
  std::__cxx11::string::string((string *)&gtest_ar_,"/tmp/",(allocator *)&AStack_2b8);
  std::__cxx11::string::string((string *)&local_278,"bucket",&local_2ac);
  local_2a8 = (undefined1  [8])0x0;
  lStack_2a0.next_ = (linked_ptr_internal *)0x0;
  local_298._M_allocated_capacity = 0;
  local_280 = 0;
  local_298._8_8_ = (_Base_ptr)&lStack_2a0;
  local_288 = (_Base_ptr)&lStack_2a0;
  AwsCommandRunner::AwsCommandRunner
            (&aws_command_runner,&multiple_command_runner,(string *)&gtest_ar_,&local_278,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2a8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::string((string *)local_2a8,"/tmp/foo",(allocator *)&gtest_ar_);
  AwsCommandRunner::CopyFile(&aws_command_runner,(string *)local_2a8);
  std::__cxx11::string::~string((string *)local_2a8);
  bVar1 = AwsCommandRunner::Finished(&aws_command_runner);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a8,(internal *)&gtest_ar_,
               (AssertionResult *)"aws_command_runner.Finished()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_2b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x4b,(char *)local_2a8);
    testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&local_278);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    bVar1 = AwsCommandRunner::PreviousCommandFailed(&aws_command_runner);
    gtest_ar_.success_ = !bVar1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_278);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_2a8,(internal *)&gtest_ar_,
                 (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_2b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                 ,0x4c,(char *)local_2a8);
      testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&local_278);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      bVar1 = AwsCommandRunner::Finished(&aws_command_runner);
      gtest_ar_.success_ = !bVar1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1) {
        testing::Message::Message((Message *)&local_278);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_2a8,(internal *)&gtest_ar_,
                   (AssertionResult *)"aws_command_runner.Finished()","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_2b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                   ,0x4d,(char *)local_2a8);
        testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&local_278);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        bVar1 = AwsCommandRunner::PreviousCommandFailed(&aws_command_runner);
        gtest_ar_.success_ = !bVar1;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar1) {
          testing::Message::Message((Message *)&local_278);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_2a8,(internal *)&gtest_ar_,
                     (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_2b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                     ,0x4e,(char *)local_2a8);
          testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&local_278);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          gtest_ar_.success_ = AwsCommandRunner::Finished(&aws_command_runner);
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (gtest_ar_.success_) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            bVar1 = AwsCommandRunner::PreviousCommandFailed(&aws_command_runner);
            gtest_ar_.success_ = !bVar1;
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar1) goto LAB_00159809;
            testing::Message::Message((Message *)&local_278);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_2a8,(internal *)&gtest_ar_,
                       (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_2b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                       ,0x50,(char *)local_2a8);
            testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&local_278);
          }
          else {
            testing::Message::Message((Message *)&local_278);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_2a8,(internal *)&gtest_ar_,
                       (AssertionResult *)"aws_command_runner.Finished()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_2b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                       ,0x4f,(char *)local_2a8);
            testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&local_278);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  std::__cxx11::string::~string((string *)local_2a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_278);
LAB_00159809:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  AwsCommandRunner::~AwsCommandRunner(&aws_command_runner);
  std::
  deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
  ::~deque(&multiple_command_runner.enqueued_commands_.c);
  anon_unknown.dwarf_103e0::MockCommandRunner::~MockCommandRunner(&command_runner);
  return;
}

Assistant:

TEST(AwsCommandRunner, CopyFile) {
  MockCommandRunner command_runner;
  MultipleCommandRunner multiple_command_runner(&command_runner);
  EXPECT_CALL(command_runner,
              RunCommand(std::vector<std::string>({
                  "aws", "s3", "rm", "--recursive", "s3://bucket/foo",
              })))
      .Times(1);
  EXPECT_CALL(command_runner,
              RunCommand(std::vector<std::string>({
                  "aws", "s3", "cp", "/tmp/foo", "s3://bucket/foo",
              })))
      .Times(1);
  EXPECT_CALL(command_runner, Finished()).WillRepeatedly(Return(true));
  EXPECT_CALL(command_runner, PreviousCommandFailed())
      .WillRepeatedly(Return(false));

  AwsCommandRunner aws_command_runner(&multiple_command_runner, "/tmp/",
                                      "bucket", {});
  aws_command_runner.CopyFile("/tmp/foo");

  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_TRUE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
}